

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

char * __thiscall CProficiencies::GetSkillLevelName(CProficiencies *this,int ind)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  string_view fmt;
  int local_4;
  
  if ((uint)ind < 0x19) {
    pcVar1 = (char *)((ulong)((long)prof_level_table.
                                    super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)prof_level_table.
                                   super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
    uVar3 = (ulong)pcVar1 & 0xffffffff;
    do {
      uVar3 = uVar3 - 1;
      uVar2 = (uint)uVar3;
      if ((int)uVar2 < 0) goto LAB_00378367;
      pcVar1 = (char *)((ulong)(uVar2 & 0x7fffffff) * 0x10);
    } while (this->profs[(uint)ind] <
             prof_level_table.super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar2 & 0x7fffffff].level);
    pcVar1 = *(char **)(pcVar1 + (long)prof_level_table.
                                       super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
LAB_00378367:
    if ((int)uVar2 < 0) {
      pcVar1 = (prof_level_table.
                super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>._M_impl.
                super__Vector_impl_data._M_start)->name;
    }
  }
  else {
    fmt._M_str = "CProficiencies::GetSkillLevelName : index out of bounds [{}]";
    fmt._M_len = 0x3c;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&local_4);
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char* CProficiencies::GetSkillLevelName(int ind)
{
	auto profs_size = std::size(profs);
	if(ind < 0 || ind > profs_size - 1)
	{
		RS.Logger.Warn("CProficiencies::GetSkillLevelName : index out of bounds [{}]", ind);
		return "";
	}

	auto slevel = profs[ind];
	auto prof_level_table_size = std::size(prof_level_table);
	for (int i = prof_level_table_size - 1; i >= 0; i--)
	{
		if (prof_level_table[i].level <= slevel)
			return prof_level_table[i].name;
	}

	return prof_level_table[0].name;
}